

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::ShaderCompile::ShaderCompile
          (ShaderCompile *this,SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,bool useSync,
          bool serverSync)

{
  Shader *pSVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40 [2];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader_local;
  ShaderCompile *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = shader;
  shader_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)this;
  Operation::Operation(&this->super_Operation,"ShaderCompile",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__ShaderCompile_03277878;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr(&this->m_shader,shader);
  pSVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  pSVar1->compiled = true;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>
            (local_40,&this->m_shader);
  Operation::modifyGLObject(&this->super_Operation,local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_40);
  return;
}

Assistant:

ShaderCompile::ShaderCompile (SharedPtr<Shader> shader, bool useSync, bool serverSync)
	: Operation	("ShaderCompile", useSync, serverSync)
	, m_shader	(shader)
{
	m_shader->compiled = true;
	modifyGLObject(SharedPtr<Object>(m_shader));
}